

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall gl3cts::TransformFeedback::LinkingErrors::testInvalidVarying(LinkingErrors *this)

{
  undefined8 gl_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  GLchar *pGVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_488;
  undefined4 local_304;
  MessageBuilder local_300;
  GLuint local_17c;
  GLint local_178;
  GLuint program;
  GLint linking_status;
  allocator<char> local_149;
  string local_148;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  string local_78;
  allocator<char> local_41;
  string local_40 [8];
  string vertex_shader;
  Functions *gl;
  LinkingErrors *this_local;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pGVar5 = s_vertex_shader_template;
  vertex_shader.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,pGVar5,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)&local_98,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"TEMPLATE_INPUT_OUTPUT_DECLARATIONS",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"in float data;\n",&local_e1);
  Utilities::preprocessCode(&local_78,&local_98,&local_b8,&local_e0);
  std::__cxx11::string::operator=(local_40,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_128,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"TEMPLATE_OUTPUT_SETTERS",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linking_status,"",(allocator<char> *)((long)&program + 3));
  Utilities::preprocessCode(&local_108,&local_128,&local_148,(string *)&linking_status);
  std::__cxx11::string::operator=(local_40,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&linking_status);
  std::allocator<char>::~allocator((allocator<char> *)((long)&program + 3));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)&local_128);
  gl_00 = vertex_shader.field_2._8_8_;
  local_178 = 1;
  pTVar3 = deqp::Context::getTestContext(this->m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  pGVar5 = (GLchar *)std::__cxx11::string::c_str();
  local_17c = Utilities::buildProgram
                        ((Functions *)gl_00,pTVar4,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,pGVar5,
                         s_fragment_shader,&s_invalid_transform_feedback_varying,1,0x8c8c,false,
                         &local_178);
  if ((local_178 == 0) && (local_17c == 0)) {
    pTVar3 = deqp::Context::getTestContext(this->m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_488,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_488,
                        (char (*) [97])
                        "Linking failed as expected when Transform Feedback varying was specified with name of variable ("
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&s_invalid_transform_feedback_varying);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [37])") that is not available for capture.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_488);
    this_local._7_1_ = true;
  }
  else {
    pTVar3 = deqp::Context::getTestContext(this->m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_300,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_300,
                        (char (*) [100])
                        "Linking unexpectedly succeded when Transform Feedback varying was specified with name of variable ("
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&s_invalid_transform_feedback_varying);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [37])") that is not available for capture.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_300);
    if (local_17c != 0) {
      (**(code **)(vertex_shader.field_2._8_8_ + 0x448))(local_17c);
    }
    this_local._7_1_ = false;
  }
  local_304 = 1;
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool gl3cts::TransformFeedback::LinkingErrors::testInvalidVarying(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*  Check if link process fails under the following conditions:
	 <varyings> specified by TransformFeedbackVaryings contains name of
	 variable that is not available for capture; */

	std::string vertex_shader(s_vertex_shader_template);

	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_INPUT_OUTPUT_DECLARATIONS", "in float data;\n");
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(vertex_shader, "TEMPLATE_OUTPUT_SETTERS", "");

	glw::GLint linking_status = 1;

	glw::GLuint program = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, vertex_shader.c_str(), s_fragment_shader,
		&s_invalid_transform_feedback_varying, 1, GL_INTERLEAVED_ATTRIBS, false, &linking_status);

	if ((GL_FALSE != linking_status) || program)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Linking unexpectedly succeded when Transform Feedback varying was specified with name of variable ("
			<< s_invalid_transform_feedback_varying << ") that is not available for capture."
			<< tcu::TestLog::EndMessage;

		if (program)
		{
			gl.deleteProgram(program);
		}

		return false;
	}

	/* Log success. */
	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Linking failed as expected when Transform Feedback varying was specified with name of variable ("
		<< s_invalid_transform_feedback_varying << ") that is not available for capture." << tcu::TestLog::EndMessage;

	return true;
}